

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

ALLEGRO_BITMAP * ObtainBitmap(char *name)

{
  int iVar1;
  char *in_RDI;
  bool bVar2;
  DATA_ENTRY *data;
  DATA_ENTRY *local_18;
  
  local_18 = demo_data;
  while( true ) {
    bVar2 = false;
    if (local_18 != (DATA_ENTRY *)0x0) {
      bVar2 = local_18->name != (char *)0x0;
    }
    if (!bVar2) break;
    iVar1 = strcmp(local_18->type,"bitmap");
    if ((iVar1 == 0) && (iVar1 = strcmp(local_18->name,in_RDI), iVar1 == 0)) {
      return (ALLEGRO_BITMAP *)local_18->dat;
    }
    local_18 = local_18 + 1;
  }
  return (ALLEGRO_BITMAP *)0x0;
}

Assistant:

ALLEGRO_BITMAP *ObtainBitmap(const char *name)
{
   DATA_ENTRY *data = demo_data;
   while (data && data->name) {
      if (!strcmp(data->type, "bitmap") &&
         !strcmp(data->name, name)) return data->dat;
      data++;
   }
   return NULL;
}